

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

void __thiscall
soul::ResolutionPass::rebuildVariableUseCounts(soul::AST::ModuleBase&)::UseCounter::visit(soul::AST
::PreOrPostIncOrDec__(void *this,PreOrPostIncOrDec *p)

{
  undefined2 uVar1;
  
  uVar1 = *(undefined2 *)((long)this + 8);
  *(undefined2 *)((long)this + 8) = 0x101;
  (**(code **)(*this + 0x18))(this,(p->target).object);
  *(undefined2 *)((long)this + 8) = uVar1;
  return;
}

Assistant:

void visit (AST::PreOrPostIncOrDec& p) override
            {
                auto oldWriting = isWriting;
                auto oldReading = isReading;
                isReading = true;
                isWriting = true;
                ASTVisitor::visit (p);
                isWriting = oldWriting;
                isReading = oldReading;
            }